

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet_base.cpp
# Opt level: O2

void __thiscall cppnet::CppNetBase::Init(CppNetBase *this,uint32_t thread_num)

{
  uint32_t uVar1;
  RangeRandom *this_00;
  pointer __p;
  uint32_t uVar2;
  bool bVar3;
  __shared_ptr<cppnet::CppNetBase,(__gnu_cxx::_Lock_policy)2> local_d0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  shared_ptr<cppnet::Dispatcher> dispatcher;
  sigset_t set;
  
  uVar1 = GetCpuNum();
  uVar2 = uVar1;
  if (thread_num < uVar1 * 2) {
    uVar2 = thread_num;
  }
  if (thread_num == 0) {
    uVar2 = uVar1;
  }
  this_00 = (RangeRandom *)operator_new(8);
  RangeRandom::RangeRandom(this_00,0,uVar2 - 1);
  set.__val[0] = 0;
  std::__uniq_ptr_impl<cppnet::RangeRandom,_std::default_delete<cppnet::RangeRandom>_>::reset
            ((__uniq_ptr_impl<cppnet::RangeRandom,_std::default_delete<cppnet::RangeRandom>_> *)
             &this->_random,this_00);
  std::unique_ptr<cppnet::RangeRandom,_std::default_delete<cppnet::RangeRandom>_>::~unique_ptr
            ((unique_ptr<cppnet::RangeRandom,_std::default_delete<cppnet::RangeRandom>_> *)&set);
  sigprocmask(2,(sigset_t *)0x0,(sigset_t *)&set);
  sigaddset((sigset_t *)&set,0xd);
  sigprocmask(2,(sigset_t *)&set,(sigset_t *)0x0);
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    std::__shared_ptr<cppnet::CppNetBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::CppNetBase,void>
              (local_d0,(__weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::make_shared<cppnet::Dispatcher,std::shared_ptr<cppnet::CppNetBase>>
              ((shared_ptr<cppnet::CppNetBase> *)&dispatcher);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
    std::
    vector<std::shared_ptr<cppnet::Dispatcher>,_std::allocator<std::shared_ptr<cppnet::Dispatcher>_>_>
    ::push_back(&this->_dispatchers,(value_type *)&dispatcher);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&dispatcher.super___shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void CppNetBase::Init(uint32_t thread_num) {
    uint32_t cpus = GetCpuNum();
    if (thread_num == 0 || thread_num >= cpus * 2) {
        thread_num = cpus;
    }
    _random = std::unique_ptr<RangeRandom>(new RangeRandom(0, thread_num - 1));

#ifndef __win__
    //Disable  SIGPIPE signal
    sigset_t set;
    sigprocmask(SIG_SETMASK, NULL, &set);
    sigaddset(&set, SIGPIPE);
    sigprocmask(SIG_SETMASK, &set, NULL);
#endif

    for (uint32_t i = 0; i < thread_num; i++) {
        auto dispatcher = std::make_shared<Dispatcher>(shared_from_this());
        _dispatchers.push_back(dispatcher);
    }
}